

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::~cubeb_async_logger(cubeb_async_logger *this)

{
  __pointer_type prVar1;
  
  if ((this->msg_queue)._M_b._M_p != (__pointer_type)0x0) {
    prVar1 = (this->msg_queue)._M_b._M_p;
    if (prVar1 != (__pointer_type)0x0) {
      std::unique_ptr<cubeb_log_message[],_std::default_delete<cubeb_log_message[]>_>::~unique_ptr
                (&prVar1->data_);
    }
    operator_delete(prVar1,0x18);
  }
  std::thread::~thread(&this->logging_thread);
  return;
}

Assistant:

~cubeb_async_logger()
  {
    assert(logging_thread.get_id() == std::thread::id() &&
           (g_cubeb_log_callback == cubeb_noop_log_callback ||
            !g_cubeb_log_callback));
    if (msg_queue.load()) {
      delete msg_queue.load();
    }
  }